

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void help(void)

{
  puts("Usage:");
  puts(" -i -- input file path");
  puts(" -o -- output file path");
  puts(
      " -m -- model <0,1,-1> , 0 for Nussinov-based model, 1 for Zuker-based model, -1 for Evaluation"
      );
  puts(
      " -s -- mode <1,2,3>, 1 for MFE only, 2 for balancing MFE and CAI at fixed lambda, 3 for lambda sweep"
      );
  puts(" -l -- lambda <[0,1]>");
  puts(" -a -- sweep increment <(0,1]>");
  puts(" -r -- input rna file path");
  puts(" -O -- sweep output csv file name");
  puts(" -g -- minimum gap allowed in Nussinov <[0,inf)>");
  puts(" -t -- threshold tau1 <(0,1)>");
  puts(" -p -- threshold tau2 <(0,1)>");
  puts(" -c -- codon usage table file path");
  puts(" -d -- directory to energy parameters");
  puts(" ...");
  return;
}

Assistant:

void help()
{
    printf("Usage:\n");
    printf(" -i -- input file path\n");
    printf(" -o -- output file path\n");
    printf(" -m -- model <0,1,-1> , 0 for Nussinov-based model, 1 for Zuker-based model, -1 for Evaluation\n");
    printf(" -s -- mode <1,2,3>, 1 for MFE only, 2 for balancing MFE and CAI at fixed lambda, 3 for lambda sweep\n");
    printf(" -l -- lambda <[0,1]>\n");
    printf(" -a -- sweep increment <(0,1]>\n");
    printf(" -r -- input rna file path\n");
    printf(" -O -- sweep output csv file name\n");
    printf(" -g -- minimum gap allowed in Nussinov <[0,inf)>\n");
    printf(" -t -- threshold tau1 <(0,1)>\n");
    printf(" -p -- threshold tau2 <(0,1)>\n");
    printf(" -c -- codon usage table file path\n");
    printf(" -d -- directory to energy parameters\n");
    printf(" ...\n");
}